

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

bool verifyResults(int numIterations,uint seed)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong siglen;
  uchar *sig;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  uint uVar4;
  uchar *in_R8;
  size_t in_R9;
  int iVar5;
  EVP_PKEY_CTX *pEVar6;
  bool bVar7;
  double dVar8;
  default_random_engine rnd;
  double elements [3000];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_5e58;
  SvdVerifier<SingularSvd> local_5e50;
  EVP_PKEY_CTX local_5df8 [24008];
  
  std::
  _Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
                 *)&local_5e50);
  iVar5 = 0;
  local_5e50.orthonormalUErrorSum = 0.0;
  local_5e50.numOrthonormalVErrors = 0;
  local_5e50.orthonormalVErrorSum = 0.0;
  local_5e50.numSingularValueDiscrepancies = 0;
  local_5e50.singularValueErrorSum = 0.0;
  local_5e50.numVerifications = 0;
  local_5e50.numReconstructionErrors = 0;
  local_5e50.reconstructionErrorSum = 0.0;
  local_5e50.numOrthonormalUErrors = 0;
  uVar3 = seed / 0x7fffffff << 0x1f | seed / 0x7fffffff;
  uVar4 = seed + uVar3;
  siglen = (ulong)uVar4;
  local_5e58._M_x = (unsigned_long)(uVar3 + seed + (uint)(uVar4 == 0));
  if (0 < numIterations) {
    do {
      uVar4 = 0xbb9;
      pEVar6 = local_5df8;
      do {
        dVar8 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&local_5e58);
        *(double *)pEVar6 = dVar8 * 20.0 + -10.0;
        pEVar6 = pEVar6 + 8;
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
      SvdVerifier<SingularSvd>::verify(&local_5e50,local_5df8,sig,siglen,in_R8,in_R9);
      iVar5 = iVar5 + 1;
    } while (iVar5 != numIterations);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"singular",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  SvdVerifier<SingularSvd>::printStatistics(&local_5e50);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  bVar1 = local_5e50.numOrthonormalUErrors == 0;
  bVar2 = local_5e50.numReconstructionErrors == 0;
  bVar7 = local_5e50.numOrthonormalVErrors == 0;
  if (local_5e50.algo.usv.
      super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
      .super__Head_base<0UL,_singular::Matrix<60,_60>,_false>._M_head_impl.pBlock != (double *)0x0)
  {
    operator_delete__((void *)local_5e50.algo.usv.
                              super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
                              .super__Head_base<0UL,_singular::Matrix<60,_60>,_false>._M_head_impl.
                              pBlock);
  }
  local_5e50.algo.usv.
  super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
  .super__Head_base<0UL,_singular::Matrix<60,_60>,_false>._M_head_impl.pBlock =
       (Matrix<60,_60>)(double *)0x0;
  if (local_5e50.algo.usv.
      super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
      .super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>.
      super__Head_base<1UL,_singular::DiagonalMatrix<60,_50>,_false>._M_head_impl.pBlock !=
      (double *)0x0) {
    operator_delete__((void *)local_5e50.algo.usv.
                              super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
                              .
                              super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
                              .super__Head_base<1UL,_singular::DiagonalMatrix<60,_50>,_false>.
                              _M_head_impl.pBlock);
  }
  local_5e50.algo.usv.
  super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
  .super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>.
  super__Head_base<1UL,_singular::DiagonalMatrix<60,_50>,_false>._M_head_impl.pBlock =
       (DiagonalMatrix<60,_50>)(double *)0x0;
  if (local_5e50.algo.usv.
      super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
      .super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>.
      super__Tuple_impl<2UL,_singular::Matrix<50,_50>_>.
      super__Head_base<2UL,_singular::Matrix<50,_50>,_false>._M_head_impl.pBlock !=
      (Matrix<50,_50>)0x0) {
    operator_delete__((void *)local_5e50.algo.usv.
                              super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
                              .
                              super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
                              .super__Tuple_impl<2UL,_singular::Matrix<50,_50>_>.
                              super__Head_base<2UL,_singular::Matrix<50,_50>,_false>._M_head_impl.
                              pBlock);
  }
  return (bVar1 && bVar2) && bVar7;
}

Assistant:

bool verifyResults(int numIterations, unsigned int seed) {
	SvdVerifier< SingularSvd > singularVerifier;
#ifdef ENABLE_EIGEN
	SvdVerifier< EigenSvd > eigenVerifier;
#endif
#ifdef ENABLE_ARMADILLO
	SvdVerifier< ArmadilloSvd > armadilloVerifier;
#endif
	std::default_random_engine rnd(seed);
	std::uniform_real_distribution< double > dist(MIN_VALUE, MAX_VALUE);
	double elements[M * N];
	for (int n = 0; n < numIterations; ++n) {
		std::generate_n(elements, M * N, [&rnd, &dist]() {
			return dist(rnd);
		});
		singularVerifier.verify(elements);
#ifdef ENABLE_EIGEN
		eigenVerifier.verify(elements);
		eigenVerifier.compareSingularValues(
			singularVerifier.getAlgorithm().getS());
#endif
#ifdef ENABLE_ARMADILLO
		armadilloVerifier.verify(elements);
		armadilloVerifier.compareSingularValues(
			singularVerifier.getAlgorithm().getS());
#endif
	}
	// shows statistics
	std::cout << "singular" << std::endl;
	singularVerifier.printStatistics();
	std::cout << std::endl;
#ifdef ENABLE_EIGEN
	std::cout << "Eigen" << std::endl;
	eigenVerifier.printStatistics();
	std::cout << std::endl;
#endif
#ifdef ENABLE_ARMADILLO
	std::cout << "Armadillo" << std::endl;
	armadilloVerifier.printStatistics();
	std::cout << std::endl;
#endif
	return singularVerifier.isVerified();
}